

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

bool __thiscall olc::ResourcePack::AddFile(ResourcePack *this,string *sFile)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  path local_a8;
  uint32_t local_7c;
  uint32_t uStack_78;
  sResourceFile e;
  path local_68;
  undefined1 local_40 [8];
  string file;
  string *sFile_local;
  ResourcePack *this_local;
  
  file.field_2._8_8_ = sFile;
  makeposix((string *)local_40,this,sFile);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_68,(string *)local_40,auto_format);
  bVar2 = std::filesystem::exists(&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  if (bVar2) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               auto_format);
    local_7c = std::filesystem::file_size(&local_a8);
    std::filesystem::__cxx11::path::~path(&local_a8);
    uStack_78 = 0;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
             ::operator[](&this->mapFiles,(key_type *)local_40);
    mVar1.nOffset = uStack_78;
    mVar1.nSize = local_7c;
    *pmVar3 = mVar1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar2;
}

Assistant:

bool ResourcePack::AddFile(const std::string &sFile)
	{
		const std::string file = makeposix(sFile);

		if (_gfs::exists(file))
		{
			sResourceFile e;
			e.nSize = (uint32_t)_gfs::file_size(file);
			e.nOffset = 0; // Unknown at this stage
			mapFiles[file] = e;
			return true;
		}
		return false;
	}